

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_name_match.cc
# Opt level: O0

bool bssl::anon_unknown_1::NormalizeValue
               (X509NameAttribute attribute,string *output,CertErrors *errors)

{
  CertErrors *pCVar1;
  bool bVar2;
  unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_> local_40;
  bool local_35;
  bool success;
  unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_> local_28;
  CertErrors *local_20;
  CertErrors *errors_local;
  string *output_local;
  
  local_20 = errors;
  errors_local = (CertErrors *)output;
  if (errors != (CertErrors *)0x0) {
    bVar2 = X509NameAttribute::ValueAsStringUnsafe(&attribute,output);
    pCVar1 = local_20;
    if (bVar2) {
      local_35 = false;
      switch(attribute.value_tag) {
      case 0xc:
      case 0x1c:
      case 0x1e:
        local_35 = NormalizeDirectoryString(NO_ENFORCEMENT,(string *)errors_local);
        break;
      default:
        local_35 = false;
        break;
      case 0x13:
        local_35 = NormalizeDirectoryString(ENFORCE_PRINTABLE_STRING,(string *)errors_local);
        break;
      case 0x16:
        local_35 = NormalizeDirectoryString(ENFORCE_ASCII,(string *)errors_local);
      }
      pCVar1 = local_20;
      if (local_35 == false) {
        CreateCertErrorParams1SizeT((bssl *)&local_40,"tag",(ulong)attribute.value_tag);
        CertErrors::AddError(pCVar1,"Failed normalizing string",&local_40);
        ::std::unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_>::
        ~unique_ptr(&local_40);
      }
      output_local._7_1_ = (bool)(local_35 & 1);
    }
    else {
      CreateCertErrorParams1SizeT((bssl *)&local_28,"tag",(ulong)attribute.value_tag);
      CertErrors::AddError(pCVar1,"Failed converting AttributeValue to string",&local_28);
      ::std::unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_>::
      ~unique_ptr(&local_28);
      output_local._7_1_ = false;
    }
    return output_local._7_1_;
  }
  abort();
}

Assistant:

[[nodiscard]] bool NormalizeValue(X509NameAttribute attribute,
                                  std::string *output, CertErrors *errors) {
  BSSL_CHECK(errors);

  if (!attribute.ValueAsStringUnsafe(output)) {
    errors->AddError(kFailedConvertingAttributeValue,
                     CreateCertErrorParams1SizeT("tag", attribute.value_tag));
    return false;
  }

  bool success = false;
  switch (attribute.value_tag) {
    case CBS_ASN1_PRINTABLESTRING:
      success = NormalizeDirectoryString(ENFORCE_PRINTABLE_STRING, output);
      break;
    case CBS_ASN1_BMPSTRING:
    case CBS_ASN1_UNIVERSALSTRING:
    case CBS_ASN1_UTF8STRING:
      success = NormalizeDirectoryString(NO_ENFORCEMENT, output);
      break;
    case CBS_ASN1_IA5STRING:
      success = NormalizeDirectoryString(ENFORCE_ASCII, output);
      break;
    default:
      // NOTREACHED
      success = false;
      break;
  }

  if (!success) {
    errors->AddError(kFailedNormalizingString,
                     CreateCertErrorParams1SizeT("tag", attribute.value_tag));
  }

  return success;
}